

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CfgNode.cpp
# Opt level: O0

void __thiscall CfgNode::BlockData::BlockData(BlockData *this,Addr addr,int size,bool indirect)

{
  int iVar1;
  Instruction *this_00;
  Instruction *i;
  int s;
  bool indirect_local;
  int size_local;
  Addr addr_local;
  BlockData *this_local;
  
  Data::Data(&this->super_Data,addr);
  (this->super_Data)._vptr_Data = (_func_int **)&PTR__BlockData_001717d8;
  this->m_size = size;
  this->m_indirect = indirect;
  std::__cxx11::list<Instruction_*,_std::allocator<Instruction_*>_>::list(&this->m_instrs);
  std::
  map<unsigned_long,_CfgCall_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_CfgCall_*>_>_>
  ::map(&this->m_calls);
  std::
  map<int,_CfgSignalHandler_*,_std::less<int>,_std::allocator<std::pair<const_int,_CfgSignalHandler_*>_>_>
  ::map(&this->m_signalHandlers);
  i._4_4_ = 0;
  while( true ) {
    if (size <= i._4_4_) {
      return;
    }
    this_00 = Instruction::get(addr + (long)i._4_4_,0);
    iVar1 = Instruction::size(this_00);
    if (iVar1 == 0) break;
    iVar1 = Instruction::size(this_00);
    i._4_4_ = iVar1 + i._4_4_;
    if (size < i._4_4_) {
      return;
    }
    addInstruction(this,this_00);
  }
  return;
}

Assistant:

CfgNode::BlockData::BlockData(Addr addr, int size, bool indirect)
	: Data(addr), m_size(size), m_indirect(indirect) {
	int s = 0;
	while (s < size) {
		Instruction* i = Instruction::get(addr + s, 0);
		if (i->size() == 0)
			break;

		s += i->size();
		if (s > size)
			break;

		this->addInstruction(i);
	}
}